

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O0

void __thiscall DepsLog::~DepsLog(DepsLog *this)

{
  DepsLog *this_local;
  
  Close(this);
  std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::~vector(&this->deps_);
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector(&this->nodes_);
  return;
}

Assistant:

DepsLog::~DepsLog() {
  Close();
}